

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

lines_t * __thiscall
backward::SourceFile::get_lines(SourceFile *this,uint line_start,uint line_count,lines_t *lines)

{
  istream *piVar1;
  char cVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  basic_ifstream<char,_std::char_traits<char>_> *pbVar8;
  string line;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  iterator local_68;
  pointer local_60;
  _Alloc_hider local_58;
  char local_48 [16];
  pointer local_38;
  
  pbVar8 = (this->_file)._val;
  std::ios::clear((int)pbVar8 + (int)*(undefined8 *)(*(long *)pbVar8 + -0x18));
  std::istream::seekg((this->_file)._val,0,0);
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  uVar7 = 1;
  if (1 < line_start) {
    pbVar8 = (this->_file)._val;
    lVar6 = *(long *)(*(long *)pbVar8 + -0x18);
    iVar5 = line_start - 1;
    do {
      cVar2 = std::ios::widen((char)lVar6 + (char)pbVar8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)pbVar8,(string *)&local_88,cVar2);
      pbVar8 = (this->_file)._val;
      lVar6 = *(long *)(*(long *)pbVar8 + -0x18);
      if (((byte)pbVar8[lVar6 + 0x20] & 5) != 0) goto LAB_0010a68e;
      iVar5 = iVar5 + -1;
      uVar7 = line_start;
    } while (iVar5 != 0);
  }
  if (uVar7 < line_count + line_start) {
    bVar4 = false;
    do {
      piVar1 = (istream *)(this->_file)._val;
      cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (piVar1,(string *)&local_88,cVar2);
      pbVar8 = (this->_file)._val;
      if (((byte)pbVar8[*(long *)(*(long *)pbVar8 + -0x18) + 0x20] & 5) != 0) goto LAB_0010a68e;
      if ((bVar4) ||
         (_Var3 = std::
                  __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<backward::SourceFile::not_isspace>>
                            (local_88,local_88 + local_80), _Var3._M_current != local_88 + local_80)
         ) {
        local_60 = (pointer)CONCAT44(local_60._4_4_,uVar7);
        local_58._M_p = local_48;
        std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_88,local_88 + local_80);
        std::
        vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
        ::emplace_back<std::pair<unsigned_int,std::__cxx11::string>>
                  ((vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                    *)lines,(pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_60);
        if (local_58._M_p != local_48) {
          operator_delete(local_58._M_p);
        }
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      uVar7 = uVar7 + 1;
    } while (line_count + line_start != uVar7);
  }
  local_38 = (lines->
             super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (lines->
             super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,std::__cxx11::string>*,std::vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>>>,__gnu_cxx::__ops::_Iter_pred<backward::SourceFile::not_isempty>>
            (&local_68);
  std::
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase(lines,local_68,
             (lines->
             super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
LAB_0010a68e:
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return lines;
}

Assistant:

lines_t &get_lines(unsigned line_start, unsigned line_count, lines_t &lines) {
    using namespace std;
    // This function make uses of the dumbest algo ever:
    //	1) seek(0)
    //	2) read lines one by one and discard until line_start
    //	3) read line one by one until line_start + line_count
    //
    // If you are getting snippets many time from the same file, it is
    // somewhat a waste of CPU, feel free to benchmark and propose a
    // better solution ;)

    _file->clear();
    _file->seekg(0);
    string line;
    unsigned line_idx;

    for (line_idx = 1; line_idx < line_start; ++line_idx) {
      std::getline(*_file, line);
      if (!*_file) {
        return lines;
      }
    }

    // think of it like a lambda in C++98 ;)
    // but look, I will reuse it two times!
    // What a good boy am I.
    struct isspace {
      bool operator()(char c) { return std::isspace(c); }
    };

    bool started = false;
    for (; line_idx < line_start + line_count; ++line_idx) {
      getline(*_file, line);
      if (!*_file) {
        return lines;
      }
      if (!started) {
        if (std::find_if(line.begin(), line.end(), not_isspace()) == line.end())
          continue;
        started = true;
      }
      lines.push_back(make_pair(line_idx, line));
    }

    lines.erase(
        std::find_if(lines.rbegin(), lines.rend(), not_isempty()).base(),
        lines.end());
    return lines;
  }